

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseDoubleHelper
          (Status *__return_storage_ptr__,JsonStreamParser *this,string *number,NumberResult *result
          )

{
  bool bVar1;
  char *str;
  StringPiece *this_00;
  StringPiece local_48;
  StringPiece local_38;
  
  bVar1 = safe_strtod(number,&(result->field_1).double_val);
  if (bVar1) {
    if ((this->loose_float_number_conversion_ != false) ||
       (((result->field_1).uint_val & 0x7fffffffffffffff) < 0x7ff0000000000000)) {
      result->type = DOUBLE;
      Status::Status(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    str = "Number exceeds the range of double.";
    this_00 = &local_38;
  }
  else {
    str = "Unable to parse number.";
    this_00 = &local_48;
  }
  StringPiece::StringPiece(this_00,str);
  ReportFailure(__return_storage_ptr__,this,*this_00);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseDoubleHelper(const std::string& number,
                                                 NumberResult* result) {
  if (!safe_strtod(number, &result->double_val)) {
    return ReportFailure("Unable to parse number.");
  }
  if (!loose_float_number_conversion_ && !std::isfinite(result->double_val)) {
    return ReportFailure("Number exceeds the range of double.");
  }
  result->type = NumberResult::DOUBLE;
  return util::Status();
}